

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TgSymGroupPerm(Abc_TgMan_t *pMan,int idx,int fSwapOnly)

{
  int iVar1;
  word *pwVar2;
  word wVar3;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong *puVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  word *pwVar20;
  word *pLimit;
  long lVar21;
  word *pwVar22;
  Abc_TgMan_t tgManCopy;
  int local_1ec;
  Abc_TgMan_t local_1b0;
  int *local_f0;
  undefined1 local_e4 [180];
  
  pwVar2 = pMan->pTruth;
  uVar11 = 1 << ((char)pMan->nVars - 6U & 0x1f);
  if (pMan->nVars < 7) {
    uVar11 = 1;
  }
  CheckConfig(pMan);
  memcpy(&local_1b0,pMan,0xc0);
  iVar1 = pMan->nVars;
  uVar19 = 1 << ((char)iVar1 - 6U & 0x1f);
  if (iVar1 < 7) {
    uVar19 = 1;
  }
  pwVar22 = pMan->pTruth;
  uVar13 = (ulong)uVar11;
  if (fSwapOnly == 0) {
    if ((int)uVar19 < 1) {
      local_1b0.pTruth = Abc_TgSymGroupPerm::pCopy;
      local_f0 = &pMan->nGVars;
      memcpy(local_e4,local_f0,0xb4);
    }
    else {
      lVar21 = (ulong)uVar19 << 3;
      lVar9 = 0;
      do {
        *(undefined8 *)((long)Abc_TgSymGroupPerm::pCopy + lVar9) =
             *(undefined8 *)((long)pwVar22 + lVar9);
        lVar9 = lVar9 + 8;
      } while (lVar21 != lVar9);
      local_1b0.pTruth = Abc_TgSymGroupPerm::pCopy;
      local_f0 = &pMan->nGVars;
      memcpy(local_e4,local_f0,0xb4);
      lVar9 = 0;
      do {
        *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
             *(undefined8 *)((long)pwVar22 + lVar9);
        lVar9 = lVar9 + 8;
      } while (lVar21 != lVar9);
    }
    bVar10 = local_1b0.pPerm[idx];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b0.nVars + -6;
      uVar17 = 1 << ((byte)iVar8 & 0x1f);
      uVar19 = local_1b0.uPhase;
      do {
        if (local_1b0.symPhase[bVar10] != '\0') {
          bVar6 = local_1b0.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b0.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            Abc_TgSymGroupPerm::pCopy[0] =
                 (s_Truths6[(int)uVar12] & Abc_TgSymGroupPerm::pCopy[0]) >> (bVar6 & 0x3f) |
                 Abc_TgSymGroupPerm::pCopy[0] << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar18 = s_Truths6[(int)uVar12];
              pwVar22 = Abc_TgSymGroupPerm::pCopy;
              uVar15 = (ulong)uVar17;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                *pwVar22 = (*pwVar22 & uVar18) >> (bVar7 & 0x3f) |
                           *pwVar22 << (bVar7 & 0x3f) & uVar18;
                pwVar22 = pwVar22 + 1;
                uVar15 = uVar15 - 1;
              } while (uVar15 != 0);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar18 = 1;
            if (1 < (int)uVar5) {
              uVar18 = (ulong)uVar5;
            }
            pwVar22 = Abc_TgSymGroupPerm::pCopy + (int)uVar5;
            pwVar20 = Abc_TgSymGroupPerm::pCopy;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar15 = 0;
                do {
                  wVar3 = pwVar20[uVar15];
                  pwVar20[uVar15] = pwVar22[uVar15];
                  pwVar22[uVar15] = wVar3;
                  uVar15 = uVar15 + 1;
                } while (uVar18 != uVar15);
              }
              pwVar20 = pwVar20 + iVar14;
              pwVar22 = pwVar22 + iVar14;
            } while (pwVar20 < Abc_TgSymGroupPerm::pCopy + (int)uVar17);
          }
          uVar19 = uVar19 ^ 1 << (uVar12 & 0x1f);
          local_1b0.uPhase = uVar19;
        }
        bVar10 = local_1b0.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b0);
    iVar8 = local_1b0.nVars;
    local_1ec = 0;
    uVar18 = uVar13;
    do {
      if ((int)uVar18 < 1) goto LAB_0050643c;
      lVar9 = uVar18 + 0x3ff;
      lVar21 = uVar18 + 0x3ff;
      uVar18 = uVar18 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar21] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar21]) {
      memcpy(local_e4,&local_1b0.nGVars,0xb4);
      local_1ec = 1;
      uVar19 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar19 = 1;
      }
      iVar1 = iVar8;
      if (0 < (int)uVar19) {
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b0.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar19 << 3 != lVar9);
      }
    }
LAB_0050643c:
    bVar10 = local_1b0.pPerm[(long)idx + 1];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b0.nVars + -6;
      uVar17 = 1 << ((byte)iVar8 & 0x1f);
      uVar19 = local_1b0.uPhase;
      do {
        if (local_1b0.symPhase[bVar10] != '\0') {
          bVar6 = local_1b0.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b0.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b0.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b0.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b0.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar18 = s_Truths6[(int)uVar12];
              uVar15 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b0.pTruth[uVar15] =
                     (local_1b0.pTruth[uVar15] & uVar18) >> (bVar7 & 0x3f) |
                     local_1b0.pTruth[uVar15] << (bVar7 & 0x3f) & uVar18;
                uVar15 = uVar15 + 1;
              } while (uVar17 != uVar15);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar18 = 1;
            if (1 < (int)uVar5) {
              uVar18 = (ulong)uVar5;
            }
            puVar16 = local_1b0.pTruth + (int)uVar5;
            pwVar22 = local_1b0.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar15 = 0;
                do {
                  uVar4 = pwVar22[uVar15];
                  pwVar22[uVar15] = puVar16[uVar15];
                  puVar16[uVar15] = uVar4;
                  uVar15 = uVar15 + 1;
                } while (uVar18 != uVar15);
              }
              pwVar22 = pwVar22 + iVar14;
              puVar16 = puVar16 + iVar14;
            } while (pwVar22 < local_1b0.pTruth + (int)uVar17);
          }
          uVar19 = uVar19 ^ 1 << (uVar12 & 0x1f);
          local_1b0.uPhase = uVar19;
        }
        bVar10 = local_1b0.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b0);
    iVar8 = local_1b0.nVars;
    uVar18 = uVar13;
    do {
      if ((int)uVar18 < 1) goto LAB_00506637;
      lVar9 = uVar18 + 0x3ff;
      lVar21 = uVar18 + 0x3ff;
      uVar18 = uVar18 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar21] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar21]) {
      memcpy(local_e4,&local_1b0.nGVars,0xb4);
      uVar19 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar19 = 1;
      }
      local_1ec = 3;
      iVar1 = iVar8;
      if (0 < (int)uVar19) {
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b0.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar19 << 3 != lVar9);
      }
    }
LAB_00506637:
    bVar10 = local_1b0.pPerm[idx];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b0.nVars + -6;
      uVar17 = 1 << ((byte)iVar8 & 0x1f);
      uVar19 = local_1b0.uPhase;
      do {
        if (local_1b0.symPhase[bVar10] != '\0') {
          bVar6 = local_1b0.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b0.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b0.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b0.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b0.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar18 = s_Truths6[(int)uVar12];
              uVar15 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b0.pTruth[uVar15] =
                     (local_1b0.pTruth[uVar15] & uVar18) >> (bVar7 & 0x3f) |
                     local_1b0.pTruth[uVar15] << (bVar7 & 0x3f) & uVar18;
                uVar15 = uVar15 + 1;
              } while (uVar17 != uVar15);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar18 = 1;
            if (1 < (int)uVar5) {
              uVar18 = (ulong)uVar5;
            }
            puVar16 = local_1b0.pTruth + (int)uVar5;
            pwVar22 = local_1b0.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar15 = 0;
                do {
                  uVar4 = pwVar22[uVar15];
                  pwVar22[uVar15] = puVar16[uVar15];
                  puVar16[uVar15] = uVar4;
                  uVar15 = uVar15 + 1;
                } while (uVar18 != uVar15);
              }
              pwVar22 = pwVar22 + iVar14;
              puVar16 = puVar16 + iVar14;
            } while (pwVar22 < local_1b0.pTruth + (int)uVar17);
          }
          uVar19 = uVar19 ^ 1 << (uVar12 & 0x1f);
          local_1b0.uPhase = uVar19;
        }
        bVar10 = local_1b0.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b0);
    iVar8 = local_1b0.nVars;
    uVar18 = uVar13;
    do {
      if ((int)uVar18 < 1) goto LAB_0050682a;
      lVar9 = uVar18 + 0x3ff;
      lVar21 = uVar18 + 0x3ff;
      uVar18 = uVar18 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar21] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar21]) {
      memcpy(local_e4,&local_1b0.nGVars,0xb4);
      uVar19 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar19 = 1;
      }
      iVar1 = iVar8;
      if ((int)uVar19 < 1) {
        local_1ec = 2;
      }
      else {
        local_1ec = 2;
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b0.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar19 << 3 != lVar9);
      }
    }
LAB_0050682a:
    Abc_TgSwapAdjacentSymGroups(&local_1b0,idx);
    CheckConfig(&local_1b0);
    iVar8 = local_1b0.nVars;
    uVar18 = uVar13;
    do {
      if ((int)uVar18 < 1) goto LAB_005068d5;
      lVar9 = uVar18 + 0x3ff;
      lVar21 = uVar18 + 0x3ff;
      uVar18 = uVar18 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar21] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar21]) {
      memcpy(local_e4,&local_1b0.nGVars,0xb4);
      uVar19 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar19 = 1;
      }
      iVar1 = iVar8;
      if ((int)uVar19 < 1) {
        local_1ec = 6;
      }
      else {
        local_1ec = 6;
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b0.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar19 << 3 != lVar9);
      }
    }
LAB_005068d5:
    bVar10 = local_1b0.pPerm[(long)idx + 1];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b0.nVars + -6;
      uVar17 = 1 << ((byte)iVar8 & 0x1f);
      uVar19 = local_1b0.uPhase;
      do {
        if (local_1b0.symPhase[bVar10] != '\0') {
          bVar6 = local_1b0.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b0.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b0.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b0.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b0.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar18 = s_Truths6[(int)uVar12];
              uVar15 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b0.pTruth[uVar15] =
                     (local_1b0.pTruth[uVar15] & uVar18) >> (bVar7 & 0x3f) |
                     local_1b0.pTruth[uVar15] << (bVar7 & 0x3f) & uVar18;
                uVar15 = uVar15 + 1;
              } while (uVar17 != uVar15);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar18 = 1;
            if (1 < (int)uVar5) {
              uVar18 = (ulong)uVar5;
            }
            puVar16 = local_1b0.pTruth + (int)uVar5;
            pwVar22 = local_1b0.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar15 = 0;
                do {
                  uVar4 = pwVar22[uVar15];
                  pwVar22[uVar15] = puVar16[uVar15];
                  puVar16[uVar15] = uVar4;
                  uVar15 = uVar15 + 1;
                } while (uVar18 != uVar15);
              }
              pwVar22 = pwVar22 + iVar14;
              puVar16 = puVar16 + iVar14;
            } while (pwVar22 < local_1b0.pTruth + (int)uVar17);
          }
          uVar19 = uVar19 ^ 1 << (uVar12 & 0x1f);
          local_1b0.uPhase = uVar19;
        }
        bVar10 = local_1b0.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b0);
    iVar8 = local_1b0.nVars;
    uVar18 = uVar13;
    do {
      if ((int)uVar18 < 1) goto LAB_00506abb;
      lVar9 = uVar18 + 0x3ff;
      lVar21 = uVar18 + 0x3ff;
      uVar18 = uVar18 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar21] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar21]) {
      memcpy(local_e4,&local_1b0.nGVars,0xb4);
      uVar19 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar19 = 1;
      }
      local_1ec = 7;
      iVar1 = iVar8;
      if (0 < (int)uVar19) {
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b0.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar19 << 3 != lVar9);
      }
    }
LAB_00506abb:
    bVar10 = local_1b0.pPerm[idx];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b0.nVars + -6;
      uVar17 = 1 << ((byte)iVar8 & 0x1f);
      uVar19 = local_1b0.uPhase;
      do {
        if (local_1b0.symPhase[bVar10] != '\0') {
          bVar6 = local_1b0.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b0.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b0.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b0.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b0.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar18 = s_Truths6[(int)uVar12];
              uVar15 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b0.pTruth[uVar15] =
                     (local_1b0.pTruth[uVar15] & uVar18) >> (bVar7 & 0x3f) |
                     local_1b0.pTruth[uVar15] << (bVar7 & 0x3f) & uVar18;
                uVar15 = uVar15 + 1;
              } while (uVar17 != uVar15);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar18 = 1;
            if (1 < (int)uVar5) {
              uVar18 = (ulong)uVar5;
            }
            puVar16 = local_1b0.pTruth + (int)uVar5;
            pwVar22 = local_1b0.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar15 = 0;
                do {
                  uVar4 = pwVar22[uVar15];
                  pwVar22[uVar15] = puVar16[uVar15];
                  puVar16[uVar15] = uVar4;
                  uVar15 = uVar15 + 1;
                } while (uVar18 != uVar15);
              }
              pwVar22 = pwVar22 + iVar14;
              puVar16 = puVar16 + iVar14;
            } while (pwVar22 < local_1b0.pTruth + (int)uVar17);
          }
          uVar19 = uVar19 ^ 1 << (uVar12 & 0x1f);
          local_1b0.uPhase = uVar19;
        }
        bVar10 = local_1b0.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b0);
    iVar8 = local_1b0.nVars;
    uVar18 = uVar13;
    do {
      if ((int)uVar18 < 1) goto LAB_00506ca5;
      lVar9 = uVar18 + 0x3ff;
      lVar21 = uVar18 + 0x3ff;
      uVar18 = uVar18 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar21] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar21]) {
      memcpy(local_e4,&local_1b0.nGVars,0xb4);
      uVar19 = 1 << ((char)iVar8 - 6U & 0x1f);
      if (iVar8 < 7) {
        uVar19 = 1;
      }
      local_1ec = 5;
      iVar1 = iVar8;
      if (0 < (int)uVar19) {
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b0.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar19 << 3 != lVar9);
      }
    }
LAB_00506ca5:
    bVar10 = local_1b0.pPerm[(long)idx + 1];
    if (-1 < (char)bVar10) {
      iVar8 = local_1b0.nVars + -6;
      uVar17 = 1 << ((byte)iVar8 & 0x1f);
      uVar19 = local_1b0.uPhase;
      do {
        if (local_1b0.symPhase[bVar10] != '\0') {
          bVar6 = local_1b0.pPermTRev[bVar10];
          uVar12 = (uint)(char)bVar6;
          if (local_1b0.nVars < 7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *local_1b0.pTruth =
                 (s_Truths6[(int)uVar12] & *local_1b0.pTruth) >> (bVar6 & 0x3f) |
                 *local_1b0.pTruth << (bVar6 & 0x3f) & s_Truths6[(int)uVar12];
          }
          else if ((char)bVar6 < '\x06') {
            if (iVar8 != 0x1f) {
              uVar18 = s_Truths6[(int)uVar12];
              uVar15 = 0;
              do {
                bVar7 = (byte)(1 << (bVar6 & 0x1f));
                local_1b0.pTruth[uVar15] =
                     (local_1b0.pTruth[uVar15] & uVar18) >> (bVar7 & 0x3f) |
                     local_1b0.pTruth[uVar15] << (bVar7 & 0x3f) & uVar18;
                uVar15 = uVar15 + 1;
              } while (uVar17 != uVar15);
            }
          }
          else if (iVar8 != 0x1f) {
            bVar6 = (byte)(uVar12 - 6);
            uVar5 = 1 << (bVar6 & 0x1f);
            iVar14 = 2 << (bVar6 & 0x1f);
            uVar18 = 1;
            if (1 < (int)uVar5) {
              uVar18 = (ulong)uVar5;
            }
            puVar16 = local_1b0.pTruth + (int)uVar5;
            pwVar22 = local_1b0.pTruth;
            do {
              if (uVar12 - 6 != 0x1f) {
                uVar15 = 0;
                do {
                  uVar4 = pwVar22[uVar15];
                  pwVar22[uVar15] = puVar16[uVar15];
                  puVar16[uVar15] = uVar4;
                  uVar15 = uVar15 + 1;
                } while (uVar18 != uVar15);
              }
              pwVar22 = pwVar22 + iVar14;
              puVar16 = puVar16 + iVar14;
            } while (pwVar22 < local_1b0.pTruth + (int)uVar17);
          }
          uVar19 = uVar19 ^ 1 << (uVar12 & 0x1f);
          local_1b0.uPhase = uVar19;
        }
        bVar10 = local_1b0.symLink[bVar10];
      } while (-1 < (char)bVar10);
    }
    CheckConfig(&local_1b0);
    uVar18 = uVar13;
    do {
      if ((int)uVar18 < 1) goto LAB_00506e98;
      lVar9 = uVar18 + 0x3ff;
      lVar21 = uVar18 + 0x3ff;
      uVar18 = uVar18 - 1;
    } while (Abc_TgSymGroupPerm::pCopy[lVar21] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= Abc_TgSymGroupPerm::pCopy[lVar21]) {
      memcpy(local_e4,&local_1b0.nGVars,0xb4);
      uVar19 = 1 << ((char)local_1b0.nVars - 6U & 0x1f);
      if (local_1b0.nVars < 7) {
        uVar19 = 1;
      }
      iVar1 = local_1b0.nVars;
      if ((int)uVar19 < 1) {
        local_1ec = 4;
      }
      else {
        local_1ec = 4;
        lVar9 = 0;
        do {
          *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9) =
               *(undefined8 *)((long)local_1b0.pTruth + lVar9);
          lVar9 = lVar9 + 8;
        } while ((ulong)uVar19 << 3 != lVar9);
      }
    }
LAB_00506e98:
    Abc_TgSwapAdjacentSymGroups(&local_1b0,idx);
    CheckConfig(&local_1b0);
    if (0 < (int)uVar11) {
      lVar9 = 0;
      do {
        if (*(long *)((long)pwVar2 + lVar9) != *(long *)((long)Abc_TgSymGroupPerm::pCopy + lVar9)) {
          __assert_fail("Abc_TtEqual(pTruth, pCopy, nWords)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                        ,0x846,"int Abc_TgSymGroupPerm(Abc_TgMan_t *, int, int)");
        }
        lVar9 = lVar9 + 8;
      } while (uVar13 * 8 - lVar9 != 0);
    }
    if (local_1ec == 0) {
      return 0;
    }
    do {
      if ((int)uVar13 < 1) goto LAB_00506fa2;
      lVar9 = uVar13 + 0x3ff;
      lVar21 = uVar13 - 1;
      uVar13 = uVar13 - 1;
    } while (pwVar2[lVar21] == Abc_TgSymGroupPerm::pCopy[lVar9]);
    if (pwVar2[lVar21] < Abc_TgSymGroupPerm::pCopy[lVar9]) {
LAB_00506fa2:
      __assert_fail("Abc_TtCompareRev(pTruth, pBest, nWords) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x849,"int Abc_TgSymGroupPerm(Abc_TgMan_t *, int, int)");
    }
    pMan->nVars = iVar1;
    memcpy(local_f0,local_e4,0xb4);
    uVar11 = 1 << ((char)iVar1 - 6U & 0x1f);
    if (iVar1 < 7) {
      uVar11 = 1;
    }
    if (0 < (int)uVar11) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)pwVar2 + lVar9) =
             *(undefined8 *)((long)Abc_TgSymGroupPerm::pBest + lVar9);
        lVar9 = lVar9 + 8;
      } while ((ulong)uVar11 << 3 != lVar9);
    }
  }
  else {
    if (0 < (int)uVar19) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)Abc_TgSymGroupPerm::pCopy + lVar9) =
             *(undefined8 *)((long)pwVar22 + lVar9);
        lVar9 = lVar9 + 8;
      } while ((ulong)uVar19 << 3 != lVar9);
    }
    local_1b0.pTruth = Abc_TgSymGroupPerm::pCopy;
    Abc_TgSwapAdjacentSymGroups(&local_1b0,idx);
    CheckConfig(&local_1b0);
    do {
      if ((int)uVar13 < 1) {
        return 0;
      }
      lVar9 = uVar13 + 0x3ff;
      lVar21 = uVar13 - 1;
      uVar13 = uVar13 - 1;
    } while (pwVar2[lVar21] == Abc_TgPermEnumerationScc::pCopy[lVar9]);
    if (Abc_TgPermEnumerationScc::pCopy[lVar9] <= pwVar2[lVar21]) {
      return 0;
    }
    memcpy(pMan,&local_1b0,0xc0);
    uVar11 = 1 << ((char)local_1b0.nVars - 6U & 0x1f);
    if (local_1b0.nVars < 7) {
      uVar11 = 1;
    }
    local_1ec = 4;
    if (0 < (int)uVar11) {
      uVar13 = 0;
      do {
        pwVar2[uVar13] = local_1b0.pTruth[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  pMan->pTruth = pwVar2;
  return local_1ec;
}

Assistant:

static int Abc_TgSymGroupPerm(Abc_TgMan_t* pMan, int idx, int fSwapOnly)
{
    word* pTruth = pMan->pTruth;
    static word pCopy[1024];
    static word pBest[1024];
    int Config = 0;
    int nWords = Abc_TtWordNum(pMan->nVars);
    Abc_TgMan_t tgManCopy, tgManBest;

    CheckConfig(pMan);
    if (fSwapOnly)
    {
        Abc_TgManCopy(&tgManCopy, pCopy, pMan);
        Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
        CheckConfig(&tgManCopy);
        if (Abc_TtCompareRev(pTruth, pCopy, nWords) < 0)
        {
            Abc_TgManCopy(pMan, pTruth, &tgManCopy);
            return 4;
        }
        return 0;
    }

    // save two copies
    Abc_TgManCopy(&tgManCopy, pCopy, pMan);
    Abc_TgManCopy(&tgManBest, pBest, pMan);
    // PXY
    // 001
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 1;
    // PXY
    // 011
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 3;
    // PXY
    // 010
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 2;
    // PXY
    // 110
    Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 6;
    // PXY
    // 111
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 7;
    // PXY
    // 101
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 5;
    // PXY
    // 100
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 4;
    // PXY
    // 000
    Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    assert(Abc_TtEqual(pTruth, pCopy, nWords));
    if (Config == 0)
        return 0;
    assert(Abc_TtCompareRev(pTruth, pBest, nWords) == 1);
    Abc_TgManCopy(pMan, pTruth, &tgManBest);
    return Config;
}